

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

bool __thiscall TypeInfo::testInvaild(TypeInfo *this)

{
  wchar16 wVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  wchar16 wVar4;
  long *plVar5;
  long *plVar6;
  wchar16 *pwVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  DOMElement *pDVar12;
  XMLCh *pXVar13;
  short *psVar14;
  long *plVar15;
  XMLCh *pXVar16;
  wchar16 *pwVar17;
  undefined1 uVar18;
  XStr local_40;
  XStr local_38;
  
  plVar5 = (long *)(**(code **)(*(long *)this->doc + 0x68))();
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("rootType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_00120547:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_001205c8;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001205c8:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_001205c8;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00120547;
LAB_00120535:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00120535;
      }
      if (wVar1 == L'\0') goto LAB_00120547;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_00120535;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  uVar18 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2a9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("rootType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_0012079c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_0012079c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00120844:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00120844;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("invalidTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar12 = findElement(this,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  pXVar13 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_40.fUnicodeForm = pXVar13;
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("simple",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar5 = (long *)(**(code **)(*(long *)pDVar12 + 0x198))(pDVar12,pXVar13,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_001209b7:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00120a3c;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00120a3c:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00120a3c;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001209b7;
LAB_001209a5:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001209a5;
      }
      if (wVar1 == L'\0') goto LAB_001209b7;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_001209a5;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2af);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00120c0b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00120c0b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00120cb1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00120cb1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  pXVar13 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_40.fUnicodeForm = pXVar13;
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("invalid",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar5 = (long *)(**(code **)(*(long *)pDVar12 + 0x198))(pDVar12,pXVar13,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
  psVar14 = (short *)(**(code **)(*plVar6 + 0x10))(plVar6);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    psVar14 = (short *)(**(code **)(*plVar6 + 0x18))(plVar6);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_00120dba;
    }
  }
  else {
    tmp = false;
LAB_00120dba:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00120f1b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00120f1b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00120fcd:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00120fcd;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*(long *)pDVar12 + 0x38))(pDVar12);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_001210cb:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_0012114e;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_0012114e:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_0012114e;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001210cb;
LAB_001210b9:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001210b9;
      }
      if (wVar1 == L'\0') goto LAB_001210cb;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_001210b9;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_0012131d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_0012131d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_001213c3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_001213c3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_001214c1:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121544;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121544:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00121544;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001214c1;
LAB_001214af:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001214af;
      }
      if (wVar1 == L'\0') goto LAB_001214c1;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_001214af;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00121713:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00121713;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_001217b9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_001217b9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_001218b7:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_0012193a;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_0012193a:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_0012193a;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001218b7;
LAB_001218a5:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001218a5;
      }
      if (wVar1 == L'\0') goto LAB_001218b7;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_001218a5;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,700);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00121b09:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00121b09;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00121baf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00121baf;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_00121cad:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121d30;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121d30:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00121d30;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00121cad;
LAB_00121c9b:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00121c9b;
      }
      if (wVar1 == L'\0') goto LAB_00121cad;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_00121c9b;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2bf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00121eff:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00121eff;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00121fa5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00121fa5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("uType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_001220a3:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122126;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122126:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00122126;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001220a3;
LAB_00122091:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00122091;
      }
      if (wVar1 == L'\0') goto LAB_001220a3;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_00122091;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("uType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_001222f5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_001222f5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_0012239b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_0012239b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  psVar14 = (short *)(**(code **)(*plVar6 + 0x10))(plVar6);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    psVar14 = (short *)(**(code **)(*plVar6 + 0x18))(plVar6);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_00122463;
    }
  }
  else {
    tmp = false;
LAB_00122463:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_001225c4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_001225c4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00122676:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00122676;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar6 = (long *)(**(code **)(*plVar5 + 0x38))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6);
  plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar15 + 0x10))(plVar15);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar15 + 0x18))(plVar15);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_0012273e;
    }
  }
  else {
    tmp = false;
LAB_0012273e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    lVar11 = (**(code **)(*plVar15 + 0x10))(plVar15);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_0012289f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar15 + 0x10))(plVar15);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_0012289f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    lVar11 = (**(code **)(*plVar15 + 0x18))(plVar15);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00122951:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00122951;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_00122a4f:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122ad2;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122ad2:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00122ad2;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00122a4f;
LAB_00122a3d:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00122a3d;
      }
      if (wVar1 == L'\0') goto LAB_00122a4f;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_00122a3d;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2cb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00122ca1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00122ca1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00122d47:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00122d47;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_00122e45:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122ec8;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122ec8:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_00122ec8;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00122e45;
LAB_00122e33:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00122e33;
      }
      if (wVar1 == L'\0') goto LAB_00122e45;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_00122e33;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2ce);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_00123097:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_00123097;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar11 == 0) {
      pcVar9 = "(null)";
      sVar10 = 6;
LAB_0012313d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar9 != (char *)0x0) {
        sVar10 = strlen(pcVar9);
        goto LAB_0012313d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pXVar13 = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prohibitedAttrType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pXVar13 == local_40.fUnicodeForm) {
LAB_0012323b:
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_001232be;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001232be:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_001232be;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pXVar16 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (XMLCh *)0x0 || pXVar13 == (XMLCh *)0x0) {
      if (pXVar13 == (XMLCh *)0x0) {
        if (local_40.fUnicodeForm == (XMLCh *)0x0) goto LAB_0012323b;
LAB_00123229:
        XVar2 = *pXVar16;
      }
      else {
        XVar2 = *pXVar13;
        if ((local_40.fUnicodeForm != (XMLCh *)0x0) && (XVar2 == L'\0')) goto LAB_00123229;
      }
      if (XVar2 == L'\0') goto LAB_0012323b;
    }
    else {
      do {
        XVar2 = *pXVar13;
        if (XVar2 == L'\0') goto LAB_00123229;
        pXVar13 = pXVar13 + 1;
        XVar3 = *pXVar16;
        pXVar16 = pXVar16 + 1;
      } while (XVar2 == XVar3);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp != false) {
    return (bool)uVar18;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2d1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nExpected values : typename \'",0x1d);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prohibitedAttrType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                             (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', uri \'",8);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                             (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
  }
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  lVar11 = (**(code **)(*plVar6 + 0x10))(plVar6);
  if (lVar11 == 0) {
    pcVar9 = "(null)";
    sVar10 = 6;
LAB_0012348d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 != (char *)0x0) {
      sVar10 = strlen(pcVar9);
      goto LAB_0012348d;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  lVar11 = (**(code **)(*plVar6 + 0x18))(plVar6);
  if (lVar11 == 0) {
    pcVar9 = "(null)";
    sVar10 = 6;
  }
  else {
    plVar5 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
    pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_00123551;
    }
    sVar10 = strlen(pcVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
LAB_00123551:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testInvaild() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;


    DOMTYPEINFOTEST(((DOMElement *)docEle)->getSchemaTypeInfo(), X("rootType"), X(""), __LINE__);

    //element invalidTest
    DOMElement *testEle = findElement(X("invalidTest"));

    testAttr = testEle->getAttributeNodeNS(X(""), X("simple"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testAttr = testEle->getAttributeNodeNS(X(""), X("invalid"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), 0, 0, __LINE__);

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    // this is a "number" of type "base" but it has a xsi:type="stringDerivedType"
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("uType"), X(""), __LINE__);
    //an undeclared element does not have anon value. Test this here
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), 0, 0, __LINE__);

    DOMElement *testEle2 = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle2->getSchemaTypeInfo(), 0, 0, __LINE__);
    
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("prohibitedAttrType"), X(""), __LINE__);

    return passed;
}